

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiOutApi::MidiOutApi(MidiOutApi *this)

{
  MidiApi::MidiApi(&this->super_MidiApi);
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiOutApi_00115b60;
  return;
}

Assistant:

MidiOutApi :: MidiOutApi( void )
  : MidiApi()
{
}